

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_getmetatable(jit_State *J,RecordFFData *rd)

{
  int iVar1;
  RecordIndex ix;
  
  ix.tab = *J->base;
  if (ix.tab != 0) {
    ix.tabv = *rd->argv;
    iVar1 = lj_record_mm_lookup(J,&ix,MM_metatable);
    *J->base = (&ix.mt)[iVar1 != 0];
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_getmetatable(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tr) {
    RecordIndex ix;
    ix.tab = tr;
    copyTV(J->L, &ix.tabv, &rd->argv[0]);
    if (lj_record_mm_lookup(J, &ix, MM_metatable))
      J->base[0] = ix.mobj;
    else
      J->base[0] = ix.mt;
  }  /* else: Interpreter will throw. */
}